

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_rc4_hmac_md5.c
# Opt level: O0

int rc4_hmac_md5_cipher(EVP_CIPHER_CTX *ctx,uchar *out,uchar *in,size_t len)

{
  int iVar1;
  size_t in_RCX;
  uchar *in_RDX;
  uchar *in_RSI;
  EVP_CIPHER_CTX *in_RDI;
  uchar mac [16];
  size_t plen;
  EVP_RC4_HMAC_MD5 *key;
  uchar auStack_48 [16];
  size_t local_38;
  RC4_KEY *local_30;
  size_t local_28;
  uchar *local_20;
  uchar *local_18;
  EVP_CIPHER_CTX *local_10;
  int local_4;
  
  local_28 = in_RCX;
  local_20 = in_RDX;
  local_18 = in_RSI;
  local_10 = in_RDI;
  local_30 = (RC4_KEY *)EVP_CIPHER_CTX_get_cipher_data(in_RDI);
  local_38 = *(size_t *)(local_30[1].data + 0x44);
  if ((local_38 == 0xffffffffffffffff) || (local_28 == local_38 + 0x10)) {
    iVar1 = EVP_CIPHER_CTX_is_encrypting(local_10);
    if (iVar1 == 0) {
      RC4(local_30,local_28,local_20,local_18);
      if (local_38 == 0xffffffffffffffff) {
        MD5_Update((MD5_CTX *)(local_30[1].data + 0x2c),local_18,local_28);
      }
      else {
        MD5_Update((MD5_CTX *)(local_30[1].data + 0x2c),local_18,local_38);
        MD5_Final(auStack_48,(MD5_CTX *)(local_30[1].data + 0x2c));
        memcpy(local_30[1].data + 0x2c,local_30[1].data + 0x15,0x5c);
        MD5_Update((MD5_CTX *)(local_30[1].data + 0x2c),auStack_48,0x10);
        MD5_Final(auStack_48,(MD5_CTX *)(local_30[1].data + 0x2c));
        iVar1 = CRYPTO_memcmp(local_18 + local_38,auStack_48,0x10);
        if (iVar1 != 0) {
          return 0;
        }
      }
    }
    else {
      if (local_38 == 0xffffffffffffffff) {
        local_38 = local_28;
      }
      MD5_Update((MD5_CTX *)(local_30[1].data + 0x2c),local_20,local_38);
      if (local_38 == local_28) {
        RC4(local_30,local_28,local_20,local_18);
      }
      else {
        if (local_20 != local_18) {
          memcpy(local_18,local_20,local_38);
        }
        MD5_Final(local_18 + local_38,(MD5_CTX *)(local_30[1].data + 0x2c));
        memcpy(local_30[1].data + 0x2c,local_30[1].data + 0x15,0x5c);
        MD5_Update((MD5_CTX *)(local_30[1].data + 0x2c),local_18 + local_38,0x10);
        MD5_Final(local_18 + local_38,(MD5_CTX *)(local_30[1].data + 0x2c));
        RC4(local_30,local_28,local_18,local_18);
      }
    }
    local_30[1].data[0x44] = 0xffffffff;
    local_30[1].data[0x45] = 0xffffffff;
    local_4 = 1;
  }
  else {
    local_4 = 0;
  }
  return local_4;
}

Assistant:

static int rc4_hmac_md5_cipher(EVP_CIPHER_CTX *ctx, unsigned char *out,
                               const unsigned char *in, size_t len)
{
    EVP_RC4_HMAC_MD5 *key = data(ctx);
# if defined(STITCHED_CALL)
    size_t rc4_off = 32 - 1 - (key->ks.x & (32 - 1)), /* 32 is $MOD from
                                                       * rc4_md5-x86_64.pl */
        md5_off = MD5_CBLOCK - key->md.num, blocks;
    unsigned int l;
# endif
    size_t plen = key->payload_length;

    if (plen != NO_PAYLOAD_LENGTH && len != (plen + MD5_DIGEST_LENGTH))
        return 0;

    if (EVP_CIPHER_CTX_is_encrypting(ctx)) {
        if (plen == NO_PAYLOAD_LENGTH)
            plen = len;
# if defined(STITCHED_CALL)
        /* cipher has to "fall behind" */
        if (rc4_off > md5_off)
            md5_off += MD5_CBLOCK;

        if (plen > md5_off && (blocks = (plen - md5_off) / MD5_CBLOCK) &&
            (OPENSSL_ia32cap_P[0] & (1 << 20)) == 0) {
            MD5_Update(&key->md, in, md5_off);
            RC4(&key->ks, rc4_off, in, out);

            rc4_md5_enc(&key->ks, in + rc4_off, out + rc4_off,
                        &key->md, in + md5_off, blocks);
            blocks *= MD5_CBLOCK;
            rc4_off += blocks;
            md5_off += blocks;
            key->md.Nh += blocks >> 29;
            key->md.Nl += blocks <<= 3;
            if (key->md.Nl < (unsigned int)blocks)
                key->md.Nh++;
        } else {
            rc4_off = 0;
            md5_off = 0;
        }
# endif
        MD5_Update(&key->md, in + md5_off, plen - md5_off);

        if (plen != len) {      /* "TLS" mode of operation */
            if (in != out)
                memcpy(out + rc4_off, in + rc4_off, plen - rc4_off);

            /* calculate HMAC and append it to payload */
            MD5_Final(out + plen, &key->md);
            key->md = key->tail;
            MD5_Update(&key->md, out + plen, MD5_DIGEST_LENGTH);
            MD5_Final(out + plen, &key->md);
            /* encrypt HMAC at once */
            RC4(&key->ks, len - rc4_off, out + rc4_off, out + rc4_off);
        } else {
            RC4(&key->ks, len - rc4_off, in + rc4_off, out + rc4_off);
        }
    } else {
        unsigned char mac[MD5_DIGEST_LENGTH];
# if defined(STITCHED_CALL)
        /* digest has to "fall behind" */
        if (md5_off > rc4_off)
            rc4_off += 2 * MD5_CBLOCK;
        else
            rc4_off += MD5_CBLOCK;

        if (len > rc4_off && (blocks = (len - rc4_off) / MD5_CBLOCK) &&
            (OPENSSL_ia32cap_P[0] & (1 << 20)) == 0) {
            RC4(&key->ks, rc4_off, in, out);
            MD5_Update(&key->md, out, md5_off);

            rc4_md5_enc(&key->ks, in + rc4_off, out + rc4_off,
                        &key->md, out + md5_off, blocks);
            blocks *= MD5_CBLOCK;
            rc4_off += blocks;
            md5_off += blocks;
            l = (key->md.Nl + (blocks << 3)) & 0xffffffffU;
            if (l < key->md.Nl)
                key->md.Nh++;
            key->md.Nl = l;
            key->md.Nh += blocks >> 29;
        } else {
            md5_off = 0;
            rc4_off = 0;
        }
# endif
        /* decrypt HMAC at once */
        RC4(&key->ks, len - rc4_off, in + rc4_off, out + rc4_off);
        if (plen != NO_PAYLOAD_LENGTH) { /* "TLS" mode of operation */
            MD5_Update(&key->md, out + md5_off, plen - md5_off);

            /* calculate HMAC and verify it */
            MD5_Final(mac, &key->md);
            key->md = key->tail;
            MD5_Update(&key->md, mac, MD5_DIGEST_LENGTH);
            MD5_Final(mac, &key->md);

            if (CRYPTO_memcmp(out + plen, mac, MD5_DIGEST_LENGTH))
                return 0;
        } else {
            MD5_Update(&key->md, out + md5_off, len - md5_off);
        }
    }

    key->payload_length = NO_PAYLOAD_LENGTH;

    return 1;
}